

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<void> __thiscall capnp::ClientHook::whenResolved(ClientHook *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  char *pcVar3;
  void *pvVar4;
  long *in_RSI;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  SourceLocation local_48;
  
  (**(code **)(*in_RSI + 0x18))(&local_48);
  pcVar3 = local_48.fileName;
  if ((char)local_48.fileName == '\x01') {
    local_58.ptr = (PromiseNode *)local_48.function;
    pPVar1 = *(PromiseArena **)((long)local_48.function + 8);
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_48.function - (long)pPVar1) < 0x28) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_58,
                 kj::_::
                 SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:115:25)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_006cc318;
      *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
    }
    else {
      *(PromiseArena **)((long)local_48.function + 8) = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)
                &((PromiseArenaMember *)((long)local_48.function + -0x30))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_58,
                 kj::_::
                 SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:115:25)>
                 ::anon_class_1_0_00000001_for_func::operator());
      ((PromiseArenaMember *)((long)local_48.function + -0x30))->arena =
           (PromiseArena *)&PTR_destroy_006cc318;
      ((PromiseArenaMember *)((long)local_48.function + -0x20))->_vptr_PromiseArenaMember =
           (_func_int **)pPVar1;
    }
    local_48.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_48.function = "then";
    local_48.lineNumber = 0x58b;
    local_48.columnNumber = 0x4c;
    local_50.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)this,&local_50,&local_48);
    OVar2.ptr = local_50.ptr;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
  }
  else {
    kj::_::readyNow();
    this->_vptr_ClientHook = (_func_int **)local_48.fileName;
  }
  OVar2.ptr = local_58.ptr;
  if ((((ulong)pcVar3 & 1) != 0) &&
     (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0)) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> ClientHook::whenResolved() {
  KJ_IF_SOME(promise, whenMoreResolved()) {
    return promise.then([](kj::Own<ClientHook>&& resolution) {
      return resolution->whenResolved();
    });
  } else {
    return kj::READY_NOW;
  }
}